

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateInlineAccessorDefinitions
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  RepeatedStringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline std::string* $classname$::add_$name$() {\n  std::string* _s = _internal_add_$name$();\n$annotate_add_mutable$  // @@protoc_insertion_point(field_add_mutable:$full_name$)\n  return _s;\n}\n"
            );
  if ((((this->super_FieldGenerator).options_)->safe_boundary_check & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "inline const std::string& $classname$::_internal_$name$(int index) const {\n  return $name$_.Get(index);\n}\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "inline const std::string& $classname$::_internal_$name$(int index) const {\n  return $name$_.InternalCheckedGet(\n      index, ::$proto_ns$::internal::GetEmptyStringAlreadyInited());\n}\n"
              );
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline const std::string& $classname$::$name$(int index) const {\n$annotate_get$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$(index);\n}\ninline std::string* $classname$::mutable_$name$(int index) {\n$annotate_mutable$  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return $name$_.Mutable(index);\n}\ninline void $classname$::set_$name$(int index, const std::string& value) {\n  $name$_.Mutable(index)->assign(value);\n$annotate_set$  // @@protoc_insertion_point(field_set:$full_name$)\n}\ninline void $classname$::set_$name$(int index, std::string&& value) {\n  $name$_.Mutable(index)->assign(std::move(value));\n$annotate_set$  // @@protoc_insertion_point(field_set:$full_name$)\n}\ninline void $classname$::set_$name$(int index, const char* value) {\n  $null_check$  $name$_.Mutable(index)->assign(value);\n$annotate_set$  // @@protoc_insertion_point(field_set_char:$full_name$)\n}\n"
            );
  if ((((this->super_FieldGenerator).options_)->opensource_runtime & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "inline void $classname$::set_$name$(int index, StringPiece value) {\n  $name$_.Mutable(index)->assign(value.data(), value.size());\n$annotate_set$  // @@protoc_insertion_point(field_set_string_piece:$full_name$)\n}\n"
              );
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline void $classname$::set_$name$(int index, const $pointer_type$* value, size_t size) {\n  $name$_.Mutable(index)->assign(\n    reinterpret_cast<const char*>(value), size);\n$annotate_set$  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n}\ninline std::string* $classname$::_internal_add_$name$() {\n  return $name$_.Add();\n}\ninline void $classname$::add_$name$(const std::string& value) {\n  $name$_.Add()->assign(value);\n$annotate_add$  // @@protoc_insertion_point(field_add:$full_name$)\n}\ninline void $classname$::add_$name$(std::string&& value) {\n  $name$_.Add(std::move(value));\n$annotate_add$  // @@protoc_insertion_point(field_add:$full_name$)\n}\ninline void $classname$::add_$name$(const char* value) {\n  $null_check$  $name$_.Add()->assign(value);\n$annotate_add$  // @@protoc_insertion_point(field_add_char:$full_name$)\n}\n"
            );
  if ((((this->super_FieldGenerator).options_)->opensource_runtime & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "inline void $classname$::add_$name$(StringPiece value) {\n  $name$_.Add()->assign(value.data(), value.size());\n$annotate_add$  // @@protoc_insertion_point(field_add_string_piece:$full_name$)\n}\n"
              );
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline void $classname$::add_$name$(const $pointer_type$* value, size_t size) {\n  $name$_.Add()->assign(reinterpret_cast<const char*>(value), size);\n$annotate_add$  // @@protoc_insertion_point(field_add_pointer:$full_name$)\n}\ninline const ::$proto_ns$::RepeatedPtrField<std::string>&\n$classname$::$name$() const {\n$annotate_list$  // @@protoc_insertion_point(field_list:$full_name$)\n  return $name$_;\n}\ninline ::$proto_ns$::RepeatedPtrField<std::string>*\n$classname$::mutable_$name$() {\n$annotate_mutable_list$  // @@protoc_insertion_point(field_mutable_list:$full_name$)\n  return &$name$_;\n}\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline std::string* $classname$::add_$name$() {\n"
      "  std::string* _s = _internal_add_$name$();\n"
      "$annotate_add_mutable$"
      "  // @@protoc_insertion_point(field_add_mutable:$full_name$)\n"
      "  return _s;\n"
      "}\n");
  if (options_.safe_boundary_check) {
    format(
        "inline const std::string& $classname$::_internal_$name$(int index) "
        "const {\n"
        "  return $name$_.InternalCheckedGet(\n"
        "      index, ::$proto_ns$::internal::GetEmptyStringAlreadyInited());\n"
        "}\n");
  } else {
    format(
        "inline const std::string& $classname$::_internal_$name$(int index) "
        "const {\n"
        "  return $name$_.Get(index);\n"
        "}\n");
  }
  format(
      "inline const std::string& $classname$::$name$(int index) const {\n"
      "$annotate_get$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$(index);\n"
      "}\n"
      "inline std::string* $classname$::mutable_$name$(int index) {\n"
      "$annotate_mutable$"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return $name$_.Mutable(index);\n"
      "}\n"
      "inline void $classname$::set_$name$(int index, const std::string& "
      "value) "
      "{\n"
      "  $name$_.Mutable(index)->assign(value);\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set:$full_name$)\n"
      "}\n"
      "inline void $classname$::set_$name$(int index, std::string&& value) {\n"
      "  $name$_.Mutable(index)->assign(std::move(value));\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set:$full_name$)\n"
      "}\n"
      "inline void $classname$::set_$name$(int index, const char* value) {\n"
      "  $null_check$"
      "  $name$_.Mutable(index)->assign(value);\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set_char:$full_name$)\n"
      "}\n");
  if (!options_.opensource_runtime) {
    format(
        "inline void "
        "$classname$::set_$name$(int index, StringPiece value) {\n"
        "  $name$_.Mutable(index)->assign(value.data(), value.size());\n"
        "$annotate_set$"
        "  // @@protoc_insertion_point(field_set_string_piece:$full_name$)\n"
        "}\n");
  }
  format(
      "inline void "
      "$classname$::set_$name$"
      "(int index, const $pointer_type$* value, size_t size) {\n"
      "  $name$_.Mutable(index)->assign(\n"
      "    reinterpret_cast<const char*>(value), size);\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n"
      "}\n"
      "inline std::string* $classname$::_internal_add_$name$() {\n"
      "  return $name$_.Add();\n"
      "}\n"
      "inline void $classname$::add_$name$(const std::string& value) {\n"
      "  $name$_.Add()->assign(value);\n"
      "$annotate_add$"
      "  // @@protoc_insertion_point(field_add:$full_name$)\n"
      "}\n"
      "inline void $classname$::add_$name$(std::string&& value) {\n"
      "  $name$_.Add(std::move(value));\n"
      "$annotate_add$"
      "  // @@protoc_insertion_point(field_add:$full_name$)\n"
      "}\n"
      "inline void $classname$::add_$name$(const char* value) {\n"
      "  $null_check$"
      "  $name$_.Add()->assign(value);\n"
      "$annotate_add$"
      "  // @@protoc_insertion_point(field_add_char:$full_name$)\n"
      "}\n");
  if (!options_.opensource_runtime) {
    format(
        "inline void $classname$::add_$name$(StringPiece value) {\n"
        "  $name$_.Add()->assign(value.data(), value.size());\n"
        "$annotate_add$"
        "  // @@protoc_insertion_point(field_add_string_piece:$full_name$)\n"
        "}\n");
  }
  format(
      "inline void "
      "$classname$::add_$name$(const $pointer_type$* value, size_t size) {\n"
      "  $name$_.Add()->assign(reinterpret_cast<const char*>(value), size);\n"
      "$annotate_add$"
      "  // @@protoc_insertion_point(field_add_pointer:$full_name$)\n"
      "}\n"
      "inline const ::$proto_ns$::RepeatedPtrField<std::string>&\n"
      "$classname$::$name$() const {\n"
      "$annotate_list$"
      "  // @@protoc_insertion_point(field_list:$full_name$)\n"
      "  return $name$_;\n"
      "}\n"
      "inline ::$proto_ns$::RepeatedPtrField<std::string>*\n"
      "$classname$::mutable_$name$() {\n"
      "$annotate_mutable_list$"
      "  // @@protoc_insertion_point(field_mutable_list:$full_name$)\n"
      "  return &$name$_;\n"
      "}\n");
}